

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cpp
# Opt level: O0

void test_object(void)

{
  uint32_t *puVar1;
  initializer_list<mjs::string> __l;
  bool bVar2;
  version vVar3;
  property_attribute pVar4;
  int iVar5;
  object *poVar6;
  wostream *pwVar7;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar8;
  wstring_view wVar9;
  string *local_bc0;
  undefined1 auStack_538 [8];
  vector<mjs::string,_std::allocator<mjs::string>_> _r_20;
  undefined1 local_518 [8];
  vector<mjs::string,_std::allocator<mjs::string>_> _l_20;
  value _r_19;
  undefined1 local_4c8 [8];
  value _l_19;
  undefined1 auStack_498 [7];
  bool _r_18;
  wchar_t *local_490;
  byte local_482;
  byte local_481;
  undefined1 auStack_480 [6];
  bool _l_18;
  bool _r_17;
  wchar_t *local_478;
  byte local_46a;
  byte local_469;
  undefined1 auStack_468 [6];
  bool _l_17;
  bool _r_16;
  wchar_t *local_460;
  byte local_452;
  byte local_451;
  undefined1 auStack_450 [6];
  bool _l_16;
  bool _r_15;
  wchar_t *local_448;
  byte local_43a;
  byte local_439;
  undefined1 auStack_438 [6];
  bool _l_15;
  bool _r_14;
  wchar_t *local_430;
  byte local_422;
  byte local_421;
  undefined1 auStack_420 [6];
  bool _l_14;
  bool _r_13;
  wchar_t *local_418;
  byte local_40a;
  byte local_409;
  undefined1 auStack_408 [6];
  bool _l_13;
  bool _r_12;
  wchar_t *local_400;
  byte local_3f1;
  undefined1 local_3f0 [7];
  bool _l_12;
  value _r_11;
  undefined1 local_3b8 [8];
  value _l_11;
  allocator<mjs::string> local_361;
  string *local_360;
  string local_358;
  string local_348;
  undefined1 local_338 [8];
  vector<mjs::string,_std::allocator<mjs::string>_> _r_10;
  vector<mjs::string,_std::allocator<mjs::string>_> _l_10;
  value _r_9;
  undefined1 local_2d0 [8];
  value _l_9;
  value _r_8;
  undefined1 local_270 [8];
  value _l_8;
  undefined1 auStack_240 [7];
  bool _r_7;
  wchar_t *local_238;
  byte local_22a;
  byte local_229;
  undefined1 auStack_228 [6];
  bool _l_7;
  bool _r_6;
  wchar_t *local_220;
  byte local_211;
  undefined1 local_210 [7];
  bool _l_6;
  byte local_1e1;
  undefined1 auStack_1e0 [7];
  bool _r_5;
  wchar_t *local_1d8;
  byte local_1ca;
  byte local_1c9;
  undefined1 auStack_1c8 [6];
  bool _l_5;
  bool _r_4;
  wchar_t *local_1c0;
  byte local_1b1;
  undefined1 local_1b0 [7];
  bool _l_4;
  byte local_181;
  undefined1 auStack_180 [7];
  bool _r_3;
  wchar_t *local_178;
  byte local_16a;
  byte local_169;
  undefined1 auStack_168 [6];
  bool _l_3;
  bool _r_2;
  wchar_t *local_160;
  byte local_152;
  byte local_151;
  undefined1 auStack_150 [6];
  bool _l_2;
  bool _r_1;
  wchar_t *local_148;
  byte local_139;
  undefined1 local_138 [7];
  bool _l_1;
  undefined1 local_128 [8];
  string n2;
  undefined1 local_108 [8];
  string n;
  vector<mjs::string,_std::allocator<mjs::string>_> _r;
  undefined1 local_d8 [8];
  vector<mjs::string,_std::allocator<mjs::string>_> _l;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string local_98;
  undefined1 local_88 [8];
  gc_heap_ptr<mjs::object> o;
  gc_heap h;
  
  puVar1 = &o.super_gc_heap_ptr_untyped.pos_;
  mjs::gc_heap::gc_heap((gc_heap *)puVar1,0x100);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"Object");
  mjs::string::string(&local_98,(gc_heap *)puVar1,&local_a8);
  _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mjs::gc_heap::make<mjs::object,mjs::string,decltype(nullptr)>
            ((gc_heap *)local_88,(string *)&o.super_gc_heap_ptr_untyped.pos_,(void **)&local_98);
  mjs::string::~string(&local_98);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  mjs::object::enumerable_property_names
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_d8,poVar6);
  n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = 0;
  n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._12_4_ = 0;
  puVar1 = &n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::vector<mjs::string,_std::allocator<mjs::string>_>::vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)puVar1);
  bVar2 = std::operator!=((vector<mjs::string,_std::allocator<mjs::string>_> *)local_d8,
                          (vector<mjs::string,_std::allocator<mjs::string>_> *)puVar1);
  if (bVar2) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x33);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"o->enumerable_property_names()");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"(std::vector<string>{})");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pbVar8 = operator<<(pwVar7,(vector<mjs::string,_std::allocator<mjs::string>_> *)local_d8);
    pwVar7 = std::operator<<(pbVar8," != ");
    pbVar8 = operator<<(pwVar7,(vector<mjs::string,_std::allocator<mjs::string>_> *)
                               &n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
    pwVar7 = std::operator<<(pbVar8,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)
             &n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_d8);
  puVar1 = &n2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"test");
  mjs::string::string((string *)local_108,(gc_heap *)&o.super_gc_heap_ptr_untyped.pos_,
                      (string_view *)puVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_138,"foo");
  mjs::string::string((string *)local_128,(gc_heap *)&o.super_gc_heap_ptr_untyped.pos_,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_138);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_150 = mjs::string::view((string *)local_108);
  bVar2 = mjs::object::has_property(poVar6,(wstring_view *)auStack_150);
  local_139 = (bVar2 ^ 0xffU) & 1;
  local_151 = 1;
  if (local_139 != 1) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x36);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(!o->has_property(n.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_139 & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_151 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_168 = mjs::string::view((string *)local_128);
  bVar2 = mjs::object::has_property(poVar6,(wstring_view *)auStack_168);
  local_152 = (bVar2 ^ 0xffU) & 1;
  local_169 = 1;
  if (local_152 != 1) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x37);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(!o->has_property(n2.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_152 & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_169 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_180 = mjs::string::view((string *)local_108);
  local_16a = mjs::object::can_put(poVar6,(wstring_view *)auStack_180);
  local_181 = 1;
  if (!(bool)local_16a) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x38);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(o->can_put(n.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_16a & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_181 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  mjs::value::value((value *)local_1b0,42.0);
  (*poVar6->_vptr_object[1])(poVar6,local_108,local_1b0,0);
  mjs::value::~value((value *)local_1b0);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_1c8 = mjs::string::view((string *)local_108);
  local_1b1 = mjs::object::has_property(poVar6,(wstring_view *)auStack_1c8);
  local_1c9 = 1;
  if (!(bool)local_1b1) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3a);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(o->has_property(n.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_1b1 & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_1c9 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_1e0 = mjs::string::view((string *)local_108);
  local_1ca = mjs::object::can_put(poVar6,(wstring_view *)auStack_1e0);
  local_1e1 = 1;
  if (!(bool)local_1ca) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3b);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(o->can_put(n.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_1ca & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_1e1 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  mjs::value::value((value *)local_210,(string *)local_128);
  pVar4 = mjs::operator|(dont_enum,dont_delete);
  pVar4 = mjs::operator|(pVar4,read_only);
  (*poVar6->_vptr_object[1])(poVar6,local_128,local_210,(ulong)pVar4);
  mjs::value::~value((value *)local_210);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_228 = mjs::string::view((string *)local_128);
  local_211 = mjs::object::has_property(poVar6,(wstring_view *)auStack_228);
  local_229 = 1;
  if (!(bool)local_211) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3d);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(o->has_property(n2.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_211 & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_229 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_240 = mjs::string::view((string *)local_128);
  bVar2 = mjs::object::can_put(poVar6,(wstring_view *)auStack_240);
  local_22a = (bVar2 ^ 0xffU) & 1;
  _l_8.field_1.field5[0x1f] = 1;
  if (local_22a != 1) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3e);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(!o->can_put(n2.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_22a & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(_l_8.field_1.field5[0x1f] & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  wVar9 = mjs::string::view((string *)local_108);
  _r_8.field_1._24_8_ = wVar9._M_len;
  (**poVar6->_vptr_object)(local_270,poVar6,(undefined1 *)((long)&_r_8.field_1 + 0x18));
  mjs::value::value((value *)&_l_9.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,42.0);
  bVar2 = mjs::operator!=((value *)local_270,
                          (value *)&_l_9.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>
                                    .super_gc_heap_ptr_untyped.pos_);
  if (bVar2) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3f);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"o->get(n.view())");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"value{42.0}");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pbVar8 = operator<<(pwVar7,(value *)local_270);
    pwVar7 = std::operator<<(pbVar8," != ");
    pbVar8 = operator<<(pwVar7,(value *)&_l_9.field_1.r_.property_name_.
                                         super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                                         .pos_);
    pwVar7 = std::operator<<(pbVar8,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  mjs::value::~value((value *)&_l_9.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)local_270);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  wVar9 = mjs::string::view((string *)local_128);
  _r_9.field_1._24_8_ = wVar9._M_len;
  (**poVar6->_vptr_object)(local_2d0,poVar6,(undefined1 *)((long)&_r_9.field_1 + 0x18));
  mjs::value::value((value *)&_l_10.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_128)
  ;
  bVar2 = mjs::operator!=((value *)local_2d0,
                          (value *)&_l_10.
                                    super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x40);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"o->get(n2.view())");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"value{n2}");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pbVar8 = operator<<(pwVar7,(value *)local_2d0);
    pwVar7 = std::operator<<(pbVar8," != ");
    pbVar8 = operator<<(pwVar7,(value *)&_l_10.
                                         super__Vector_base<mjs::string,_std::allocator<mjs::string>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pwVar7 = std::operator<<(pbVar8,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  mjs::value::~value((value *)&_l_10.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  mjs::value::~value((value *)local_2d0);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  mjs::object::enumerable_property_names
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)
             &_r_10.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,poVar6);
  local_360 = &local_358;
  mjs::string::string(local_360,(string *)local_108);
  local_348.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)&local_358;
  local_348.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = 1;
  std::allocator<mjs::string>::allocator(&local_361);
  __l._M_len = local_348.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_;
  __l._M_array = (iterator)
                 local_348.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
  std::vector<mjs::string,_std::allocator<mjs::string>_>::vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_338,__l,&local_361);
  std::allocator<mjs::string>::~allocator(&local_361);
  local_bc0 = &local_348;
  do {
    local_bc0 = local_bc0 + -1;
    mjs::string::~string(local_bc0);
  } while (local_bc0 != &local_358);
  bVar2 = std::operator!=((vector<mjs::string,_std::allocator<mjs::string>_> *)
                          &_r_10.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<mjs::string,_std::allocator<mjs::string>_> *)local_338);
  if (bVar2) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x41);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"o->enumerable_property_names()");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"(std::vector<string>{n})");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pbVar8 = operator<<(pwVar7,(vector<mjs::string,_std::allocator<mjs::string>_> *)
                               &_r_10.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    pwVar7 = std::operator<<(pbVar8," != ");
    pbVar8 = operator<<(pwVar7,(vector<mjs::string,_std::allocator<mjs::string>_> *)local_338);
    pwVar7 = std::operator<<(pbVar8,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_338);
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)
             &_r_10.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  mjs::value::value((value *)&_l_11.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,(string *)local_108);
  (*poVar6->_vptr_object[1])(poVar6,local_108,(undefined1 *)((long)&_l_11.field_1 + 0x18),0);
  mjs::value::~value((value *)&_l_11.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  wVar9 = mjs::string::view((string *)local_108);
  _r_11.field_1._24_8_ = wVar9._M_len;
  (**poVar6->_vptr_object)(local_3b8,poVar6,(undefined1 *)((long)&_r_11.field_1 + 0x18));
  mjs::value::value((value *)local_3f0,(string *)local_108);
  bVar2 = mjs::operator!=((value *)local_3b8,(value *)local_3f0);
  if (bVar2) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x43);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"o->get(n.view())");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"value{n}");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pbVar8 = operator<<(pwVar7,(value *)local_3b8);
    pwVar7 = std::operator<<(pbVar8," != ");
    pbVar8 = operator<<(pwVar7,(value *)local_3f0);
    pwVar7 = std::operator<<(pbVar8,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  mjs::value::~value((value *)local_3f0);
  mjs::value::~value((value *)local_3b8);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_408 = mjs::string::view((string *)local_108);
  iVar5 = (*poVar6->_vptr_object[2])(poVar6,auStack_408);
  local_3f1 = (byte)iVar5 & 1;
  local_409 = 1;
  if (local_3f1 != 1) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x44);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(o->delete_property(n.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_3f1 & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_409 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_420 = mjs::string::view((string *)local_108);
  bVar2 = mjs::object::has_property(poVar6,(wstring_view *)auStack_420);
  local_40a = (bVar2 ^ 0xffU) & 1;
  local_421 = 1;
  if (local_40a != 1) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x45);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(!o->has_property(n.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_40a & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_421 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_438 = mjs::string::view((string *)local_108);
  local_422 = mjs::object::can_put(poVar6,(wstring_view *)auStack_438);
  local_439 = 1;
  if (!(bool)local_422) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x46);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(o->can_put(n.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_422 & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_439 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_450 = mjs::string::view((string *)local_128);
  local_43a = mjs::object::has_property(poVar6,(wstring_view *)auStack_450);
  local_451 = 1;
  if (!(bool)local_43a) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x47);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(o->has_property(n2.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_43a & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_451 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_468 = mjs::string::view((string *)local_128);
  bVar2 = mjs::object::can_put(poVar6,(wstring_view *)auStack_468);
  local_452 = (bVar2 ^ 0xffU) & 1;
  local_469 = 1;
  if (local_452 != 1) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x48);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(!o->can_put(n2.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_452 & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_469 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_480 = mjs::string::view((string *)local_128);
  iVar5 = (*poVar6->_vptr_object[2])(poVar6,auStack_480);
  local_46a = ((byte)iVar5 ^ 0xff) & 1;
  local_481 = 1;
  if (local_46a != 1) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x49);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(!o->delete_property(n2.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_46a & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_481 & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  _auStack_498 = mjs::string::view((string *)local_128);
  local_482 = mjs::object::has_property(poVar6,(wstring_view *)auStack_498);
  _l_19.field_1.field5[0x1f] = 1;
  if (!(bool)local_482) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x4a);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"!!(o->has_property(n2.view()))");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"true");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(local_482 & 1));
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,(bool)(_l_19.field_1.field5[0x1f] & 1));
    pwVar7 = std::operator<<(pwVar7,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  wVar9 = mjs::string::view((string *)local_128);
  _r_19.field_1._24_8_ = wVar9._M_len;
  (**poVar6->_vptr_object)(local_4c8,poVar6,(undefined1 *)((long)&_r_19.field_1 + 0x18));
  mjs::value::value((value *)&_l_20.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_128)
  ;
  bVar2 = mjs::operator!=((value *)local_4c8,
                          (value *)&_l_20.
                                    super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x4b);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"o->get(n2.view())");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"value{n2}");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pbVar8 = operator<<(pwVar7,(value *)local_4c8);
    pwVar7 = std::operator<<(pbVar8," != ");
    pbVar8 = operator<<(pwVar7,(value *)&_l_20.
                                         super__Vector_base<mjs::string,_std::allocator<mjs::string>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pwVar7 = std::operator<<(pbVar8,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
    abort();
  }
  mjs::value::~value((value *)&_l_20.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  mjs::value::~value((value *)local_4c8);
  poVar6 = mjs::gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_88);
  mjs::object::enumerable_property_names
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_518,poVar6);
  auStack_538 = (undefined1  [8])0x0;
  _r_20.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  _r_20.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<mjs::string,_std::allocator<mjs::string>_>::vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)auStack_538);
  bVar2 = std::operator!=((vector<mjs::string,_std::allocator<mjs::string>_> *)local_518,
                          (vector<mjs::string,_std::allocator<mjs::string>_> *)auStack_538);
  if (!bVar2) {
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)auStack_538);
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_518);
    mjs::string::~string((string *)local_128);
    mjs::string::~string((string *)local_108);
    mjs::gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_88);
    mjs::gc_heap::garbage_collect((gc_heap *)&o.super_gc_heap_ptr_untyped.pos_);
    iVar5 = mjs::gc_heap::use_percentage((gc_heap *)&o.super_gc_heap_ptr_untyped.pos_);
    if (iVar5 == 0) {
      mjs::gc_heap::~gc_heap((gc_heap *)&o.super_gc_heap_ptr_untyped.pos_);
      return;
    }
    __assert_fail("h.use_percentage() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                  ,0x50,"void test_object()");
  }
  pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
  pwVar7 = std::operator<<(pwVar7," in ");
  pwVar7 = std::operator<<(pwVar7,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                          );
  pwVar7 = std::operator<<(pwVar7,":");
  pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x4c);
  pwVar7 = std::operator<<(pwVar7,":\n");
  pwVar7 = std::operator<<(pwVar7,"o->enumerable_property_names()");
  pwVar7 = std::operator<<(pwVar7," != ");
  pwVar7 = std::operator<<(pwVar7,"(std::vector<string>{})");
  pwVar7 = std::operator<<(pwVar7,"\n");
  pbVar8 = operator<<(pwVar7,(vector<mjs::string,_std::allocator<mjs::string>_> *)local_518);
  pwVar7 = std::operator<<(pbVar8," != ");
  pbVar8 = operator<<(pwVar7,(vector<mjs::string,_std::allocator<mjs::string>_> *)auStack_538);
  pwVar7 = std::operator<<(pbVar8,"\n");
  vVar3 = tested_version();
  pbVar8 = mjs::operator<<(pwVar7,vVar3);
  std::operator<<(pbVar8,"\n");
  abort();
}

Assistant:

void test_object() {
    gc_heap h{1<<8};
    {
        auto o = h.make<object>(string{h, "Object"}, nullptr);
        REQUIRE_EQ(o->enumerable_property_names(), (std::vector<string>{}));
        const auto n = string{h,"test"};
        const auto n2 = string{h,"foo"};
        REQUIRE(!o->has_property(n.view()));
        REQUIRE(!o->has_property(n2.view()));
        REQUIRE(o->can_put(n.view()));
        o->put(n, value{42.0});
        REQUIRE(o->has_property(n.view()));
        REQUIRE(o->can_put(n.view()));
        o->put(n2, value{n2}, property_attribute::dont_enum | property_attribute::dont_delete | property_attribute::read_only);
        REQUIRE(o->has_property(n2.view()));
        REQUIRE(!o->can_put(n2.view()));
        REQUIRE_EQ(o->get(n.view()), value{42.0});
        REQUIRE_EQ(o->get(n2.view()), value{n2});
        REQUIRE_EQ(o->enumerable_property_names(), (std::vector<string>{n}));
        o->put(n, value{n});
        REQUIRE_EQ(o->get(n.view()), value{n});
        REQUIRE(o->delete_property(n.view()));
        REQUIRE(!o->has_property(n.view()));
        REQUIRE(o->can_put(n.view()));
        REQUIRE(o->has_property(n2.view()));
        REQUIRE(!o->can_put(n2.view()));
        REQUIRE(!o->delete_property(n2.view()));
        REQUIRE(o->has_property(n2.view()));
        REQUIRE_EQ(o->get(n2.view()), value{n2});
        REQUIRE_EQ(o->enumerable_property_names(), (std::vector<string>{}));
    }

    h.garbage_collect();
    assert(h.use_percentage() == 0);
}